

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,uint size,int neg)

{
  char *pcVar1;
  uint local_64;
  uint local_58;
  uint local_48;
  uint local_34;
  uint i;
  char *buff;
  int neg_local;
  uint size_local;
  int islittle_local;
  lua_Unsigned n_local;
  luaL_Buffer *b_local;
  
  pcVar1 = luaL_prepbuffsize(b,(ulong)size);
  if (islittle == 0) {
    local_48 = size - 1;
  }
  else {
    local_48 = 0;
  }
  pcVar1[local_48] = (char)n;
  _size_local = n;
  for (local_34 = 1; local_34 < size; local_34 = local_34 + 1) {
    if (islittle == 0) {
      local_58 = (size - 1) - local_34;
    }
    else {
      local_58 = local_34;
    }
    pcVar1[local_58] = (char)(_size_local >> 8);
    _size_local = _size_local >> 8;
  }
  if ((neg != 0) && (8 < size)) {
    for (local_34 = 8; local_34 < size; local_34 = local_34 + 1) {
      if (islittle == 0) {
        local_64 = (size - 1) - local_34;
      }
      else {
        local_64 = local_34;
      }
      pcVar1[local_64] = -1;
    }
  }
  b->n = (ulong)size + b->n;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, unsigned size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  unsigned i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}